

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O0

int __thiscall mpt::pipe<int>::~pipe(pipe<int> *this,int *__pipedes)

{
  bool bVar1;
  int extraout_EAX;
  pipe<int> *this_local;
  
  do {
    bVar1 = pop(this,(int *)0x0);
  } while (bVar1);
  reference<mpt::pipe<int>::instance>::~reference(&this->_d);
  return extraout_EAX;
}

Assistant:

~pipe()
	{
		while (pop());
	}